

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void glfwSetTime(double time)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if ((0.0 <= time) && (time <= 18446744073.0)) {
    uVar1 = _glfwPlatformGetTimerValue();
    uVar2 = _glfwPlatformGetTimerFrequency();
    auVar4._8_4_ = (int)(uVar2 >> 0x20);
    auVar4._0_8_ = uVar2;
    auVar4._12_4_ = 0x45300000;
    dVar5 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * time;
    uVar3 = (ulong)dVar5;
    _glfw.timer.offset =
         uVar1 - ((long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3);
    return;
  }
  _glfwInputError(0x10004,"Invalid time %f");
  return;
}

Assistant:

GLFWAPI void glfwSetTime(double time)
{
    _GLFW_REQUIRE_INIT();

    if (time != time || time < 0.0 || time > 18446744073.0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid time %f", time);
        return;
    }

    _glfw.timer.offset = _glfwPlatformGetTimerValue() -
        (uint64_t) (time * _glfwPlatformGetTimerFrequency());
}